

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

bool ImGui::DockContextCalcDropPosForDocking
               (ImGuiWindow *target,ImGuiDockNode *target_node,ImGuiWindow *payload,
               ImGuiDir split_dir,bool split_outer,ImVec2 *out_pos)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  ImVec2 IVar5;
  bool bVar6;
  ImGuiDockPreviewData split_data;
  ImGuiDockPreviewData local_158;
  
  if ((target_node != (ImGuiDockNode *)0x0) && (target_node->ParentNode == (ImGuiDockNode *)0x0)) {
    split_outer = (bool)(split_dir != -1 & (*(byte *)((long)&target_node->MergedFlags + 1) & 8) >> 3
                        | split_outer);
  }
  ImGuiDockPreviewData::ImGuiDockPreviewData(&local_158);
  DockNodePreviewDockSetup(target,target_node,payload,&local_158,false,split_outer);
  fVar1 = local_158.DropRectsDraw[(long)split_dir + 1].Min.x;
  fVar2 = local_158.DropRectsDraw[(long)split_dir + 1].Min.y;
  fVar3 = local_158.DropRectsDraw[(long)split_dir + 1].Max.x;
  fVar4 = local_158.DropRectsDraw[(long)split_dir + 1].Max.y;
  bVar6 = fVar2 <= fVar4 && fVar1 <= fVar3;
  if (bVar6) {
    IVar5.y = (fVar2 + fVar4) * 0.5;
    IVar5.x = (fVar1 + fVar3) * 0.5;
    *out_pos = IVar5;
  }
  ImGuiDockNode::~ImGuiDockNode(&local_158.FutureNode);
  return bVar6;
}

Assistant:

bool ImGui::DockContextCalcDropPosForDocking(ImGuiWindow* target, ImGuiDockNode* target_node, ImGuiWindow* payload, ImGuiDir split_dir, bool split_outer, ImVec2* out_pos)
{
    // In DockNodePreviewDockSetup() for a root central node instead of showing both "inner" and "outer" drop rects
    // (which would be functionally identical) we only show the outer one. Reflect this here.
    if (target_node && target_node->ParentNode == NULL && target_node->IsCentralNode() && split_dir != ImGuiDir_None)
        split_outer = true;
    ImGuiDockPreviewData split_data;
    DockNodePreviewDockSetup(target, target_node, payload, &split_data, false, split_outer);
    if (split_data.DropRectsDraw[split_dir+1].IsInverted())
        return false;
    *out_pos = split_data.DropRectsDraw[split_dir+1].GetCenter();
    return true;
}